

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O0

int __thiscall crnlib::dynamic_stream::open(dynamic_stream *this,char *__file,int __oflag,...)

{
  undefined4 in_ECX;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  (*(this->super_data_stream)._vptr_data_stream[3])();
  (this->super_data_stream).field_0x1a = (this->super_data_stream).field_0x1a & 0xfe | 1;
  vector<unsigned_char>::clear((vector<unsigned_char> *)this);
  vector<unsigned_char>::resize
            ((vector<unsigned_char> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x18,0));
  this->m_ofs = 0;
  dynamic_string::set((dynamic_string *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                      (char *)&(this->super_data_stream).m_name,(uint)((ulong)this >> 0x20));
  (this->super_data_stream).m_attribs = (attribs_t)in_ECX;
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

bool open(uint initial_size = 0, const char* pName = "dynamic_stream", uint attribs = cDataStreamSeekable | cDataStreamWritable | cDataStreamReadable) {
    close();

    m_opened = true;
    m_buf.clear();
    m_buf.resize(initial_size);
    m_ofs = 0;
    m_name.set(pName ? pName : "dynamic_stream");
    m_attribs = static_cast<attribs_t>(attribs);
    return true;
  }